

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
          (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this,size_t size)

{
  size_t __t;
  char *__first;
  pointer p;
  size_t sVar1;
  char *__result;
  char *new_data;
  char *old_data;
  size_t new_capacity;
  size_t old_capacity;
  size_t size_local;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this_local;
  
  __t = detail::buffer<char>::capacity(&this->super_buffer<char>);
  old_data = (char *)(__t + (__t >> 1));
  if (old_data < size) {
    old_data = (char *)size;
  }
  __first = detail::buffer<char>::data(&this->super_buffer<char>);
  p = std::allocator_traits<std::allocator<char>_>::allocate(&this->alloc_,(size_type)old_data);
  sVar1 = detail::buffer<char>::size(&this->super_buffer<char>);
  __result = detail::make_checked<char>(p,(size_t)old_data);
  std::uninitialized_copy<char*,char*>(__first,__first + sVar1,__result);
  detail::buffer<char>::set(&this->super_buffer<char>,p,(size_t)old_data);
  if (__first != this->store_) {
    __gnu_cxx::new_allocator<char>::deallocate((new_allocator<char> *)&this->alloc_,__first,__t);
  }
  return;
}

Assistant:

void basic_memory_buffer<T, SIZE, Allocator>::grow(size_t size) {
#ifdef FMT_FUZZ
  if (size > 5000) throw std::runtime_error("fuzz mode - won't grow that much");
#endif
  size_t old_capacity = this->capacity();
  size_t new_capacity = old_capacity + old_capacity / 2;
  if (size > new_capacity) new_capacity = size;
  T* old_data = this->data();
  T* new_data =
      std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(old_data, old_data + this->size(),
                          detail::make_checked(new_data, new_capacity));
  this->set(new_data, new_capacity);
  // deallocate must not throw according to the standard, but even if it does,
  // the buffer already uses the new storage and will deallocate it in
  // destructor.
  if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
}